

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val.hpp
# Opt level: O3

Up __thiscall
yactfr::internal::
JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
::_clone(JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
         *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  _func_int *local_40;
  _func_int *local_38;
  _func_int *local_30;
  _func_int *local_28;
  
  pp_Var2 = (_func_int **)operator_new(0x48);
  local_40 = (_func_int *)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)(in_RSI + 0x28),
             *(long *)(in_RSI + 0x30) + *(long *)(in_RSI + 0x28));
  pp_Var2[4] = *(_func_int **)(in_RSI + 0x20);
  p_Var1 = *(_func_int **)(in_RSI + 0x18);
  pp_Var2[2] = *(_func_int **)(in_RSI + 0x10);
  pp_Var2[3] = p_Var1;
  *(undefined4 *)(pp_Var2 + 1) = 5;
  *pp_Var2 = (_func_int *)&PTR__JsonVal_002fd210;
  if ((_func_int **)local_40 == &local_30) {
    pp_Var2[5] = (_func_int *)(pp_Var2 + 7);
    pp_Var2[7] = local_30;
    pp_Var2[8] = local_28;
  }
  else {
    pp_Var2[5] = local_40;
    pp_Var2[7] = local_30;
  }
  pp_Var2[6] = local_38;
  *pp_Var2 = (_func_int *)&PTR__JsonScalarVal_002fd5d0;
  (this->super_JsonVal)._vptr_JsonVal = pp_Var2;
  return (__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
            )this;
}

Assistant:

JsonVal::Up _clone() const override
    {
        return std::make_unique<const JsonScalarVal<ValT, KindV>>(this->_val(), this->loc());
    }